

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O2

Generation * Generation::create(string *path,int umask,bool isToken)

{
  Generation *this;
  string local_40;
  
  this = (Generation *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_40,(string *)path);
  Generation(this,&local_40,umask,isToken);
  std::__cxx11::string::~string((string *)&local_40);
  if ((isToken) && (this->genMutex == (Mutex *)0x0)) {
    (*this->_vptr_Generation[1])(this);
    this = (Generation *)0x0;
  }
  return this;
}

Assistant:

Generation* Generation::create(const std::string path, int umask, bool isToken)
{
	Generation* gen = new Generation(path, umask, isToken);
	if ((gen != NULL) && isToken && (gen->genMutex == NULL))
	{
		delete gen;

		return NULL;
	}
	return gen;
}